

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NaVector.cpp
# Opt level: O3

void __thiscall NaVector::cov(NaVector *this,NaVector *rVectY,NaVector *rVectMCF)

{
  int iVar1;
  int iVar2;
  undefined4 extraout_var;
  int iVar3;
  int iVar4;
  int iVar5;
  double extraout_XMM0_Qa;
  double extraout_XMM0_Qa_00;
  double dVar6;
  double extraout_XMM0_Qa_01;
  double extraout_XMM0_Qa_02;
  double extraout_XMM0_Qa_03;
  double extraout_XMM0_Qa_04;
  int local_74;
  
  iVar1 = (*this->_vptr_NaVector[6])();
  iVar2 = (*rVectY->_vptr_NaVector[6])(rVectY);
  if (iVar2 < iVar1) {
    iVar1 = (*rVectY->_vptr_NaVector[6])(rVectY);
  }
  if (iVar1 != 0) {
    (*rVectMCF->_vptr_NaVector[4])(rVectMCF,(ulong)(iVar1 * 2 - 1));
    (*this->_vptr_NaVector[0x11])(this);
    (*rVectY->_vptr_NaVector[0x11])(rVectY);
    iVar2 = 1;
    iVar4 = 1 - iVar1;
    if (iVar4 < iVar1) {
      local_74 = -1;
      iVar3 = iVar1 + -1;
      do {
        if (iVar4 < 0) {
          if (iVar1 <= iVar4) goto LAB_00154b34;
          iVar5 = 0;
          dVar6 = 0.0;
          do {
            (*rVectY->_vptr_NaVector[10])(rVectY,(long)iVar5 % (long)iVar1 & 0xffffffff);
            (*this->_vptr_NaVector[9])(this,(long)(iVar3 + iVar5) % (long)iVar1 & 0xffffffff);
            dVar6 = dVar6 + (extraout_XMM0_Qa_04 - extraout_XMM0_Qa) *
                            (extraout_XMM0_Qa_03 - extraout_XMM0_Qa_00);
            iVar5 = iVar5 + 1;
          } while (iVar5 < iVar1 - iVar4);
        }
        else if (iVar4 + iVar1 == 0 || SCARRY4(iVar4,iVar1) != iVar4 + iVar1 < 0) {
LAB_00154b34:
          dVar6 = 0.0;
        }
        else {
          iVar5 = 0;
          dVar6 = 0.0;
          do {
            (*this->_vptr_NaVector[9])(this,(long)iVar5 % (long)iVar1 & 0xffffffff);
            (*rVectY->_vptr_NaVector[10])(rVectY,(long)(iVar4 + iVar5) % (long)iVar1 & 0xffffffff);
            dVar6 = dVar6 + (extraout_XMM0_Qa_02 - extraout_XMM0_Qa_00) *
                            (extraout_XMM0_Qa_01 - extraout_XMM0_Qa);
            iVar5 = iVar5 + 1;
          } while (local_74 + iVar5 != 0);
        }
        iVar5 = (*rVectMCF->_vptr_NaVector[8])(rVectMCF,(ulong)(uint)(iVar1 + -1 + iVar4));
        *(double *)CONCAT44(extraout_var,iVar5) = dVar6 / (double)iVar1;
        iVar4 = iVar4 + 1;
        iVar2 = iVar2 + 1;
        local_74 = local_74 + -1;
        iVar3 = iVar3 + -1;
      } while (iVar2 != iVar1 * 2);
    }
  }
  return;
}

Assistant:

void
NaVector::cov (const NaVector& rVectY, NaVector& rVectMCF) const
{
    int         k, t, N = (int)dim();

    if(N > (int)rVectY.dim())
        N = rVectY.dim();

    if(0 == N)
        return;

    rVectMCF.new_dim(2*N - 1);

    NaReal      fAvgX = average(), fAvgY = rVectY.average();

    // Compute MCF
    for(k = - N + 1; k < N; ++k){
        NaReal  fSum = 0;

        if(k < 0){
            for(t = 0; t < N - k; ++t){
                fSum += (rVectY(t % N) - fAvgY) * (get((t - k) % N) - fAvgX);
            }
        }else{// k >= 0
            for(t = 0; t < N + k; ++t){
                fSum += (get(t % N) - fAvgX) * (rVectY((t + k) % N) - fAvgY);
            }
        }
        rVectMCF[k + N - 1] = fSum / N;
    }
}